

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O0

void __thiscall
QThreadStorageData::QThreadStorageData(QThreadStorageData *this,_func_void_void_ptr *func)

{
  int iVar1;
  long lVar2;
  Type *this_00;
  QThreadData *pQVar3;
  qsizetype qVar4;
  const_reference pp_Var5;
  reference pp_Var6;
  _func_void_void_ptr *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  QThreadData *data;
  DestructorMap *destr;
  QMutexLocker<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
  *in_stack_ffffffffffffff68;
  QMutexLocker<QBasicMutex> *in_stack_ffffffffffffff70;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QBasicMutex>::QMutexLocker
            (in_stack_ffffffffffffff70,(QBasicMutex *)in_stack_ffffffffffffff68);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
            operator()(in_stack_ffffffffffffff68);
  if (this_00 == (Type *)0x0) {
    pQVar3 = QThreadData::current();
    qVar4 = QList<void_*>::size(&pQVar3->tls);
    *in_RDI = (int)qVar4;
  }
  else {
    *in_RDI = 0;
    while ((iVar1 = *in_RDI, qVar4 = QList<void_(*)(void_*)>::size(this_00), iVar1 < qVar4 &&
           (pp_Var5 = QList<void_(*)(void_*)>::at
                                ((QList<void_(*)(void_*)> *)in_stack_ffffffffffffff70,
                                 (qsizetype)in_stack_ffffffffffffff68),
           *pp_Var5 != (_func_void_void_ptr *)0x0))) {
      *in_RDI = *in_RDI + 1;
    }
    iVar1 = *in_RDI;
    qVar4 = QList<void_(*)(void_*)>::size(this_00);
    if (iVar1 == qVar4) {
      QList<void_(*)(void_*)>::append
                ((QList<void_(*)(void_*)> *)0x6d6963,(parameter_type)in_stack_ffffffffffffff68);
    }
    else {
      pp_Var6 = QList<void_(*)(void_*)>::operator[]
                          ((QList<void_(*)(void_*)> *)in_stack_ffffffffffffff70,
                           (qsizetype)in_stack_ffffffffffffff68);
      *pp_Var6 = in_RSI;
    }
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QThreadStorageData::QThreadStorageData(void (*func)(void *))
{
    QMutexLocker locker(&destructorsMutex);
    DestructorMap *destr = destructors();
    if (!destr) {
        /*
         the destructors vector has already been destroyed, yet a new
         QThreadStorage is being allocated. this can only happen during global
         destruction, at which point we assume that there is only one thread.
         in order to keep QThreadStorage working, we need somewhere to store
         the data, best place we have in this situation is at the tail of the
         current thread's tls vector. the destructor is ignored, since we have
         no where to store it, and no way to actually call it.
         */
        QThreadData *data = QThreadData::current();
        id = data->tls.size();
        DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p cannot be stored", id, func);
        return;
    }
    for (id = 0; id < destr->size(); id++) {
        if (destr->at(id) == nullptr)
            break;
    }
    if (id == destr->size()) {
        destr->append(func);
    } else {
        (*destr)[id] = func;
    }
    DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p", id, func);
}